

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrqfa.cc
# Opt level: O3

void predict_or_learn<false>(LRQFAstate *lrq,single_learner *base,example *ec)

{
  size_t *__s;
  features *this;
  byte bVar1;
  uint uVar2;
  vw *pvVar3;
  _func_void_weight_ptr_void_ptr *p_Var4;
  element_type *peVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar6;
  int iVar7;
  int iVar8;
  uint64_t *puVar9;
  _Alloc_hider this_01;
  byte *pbVar10;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> _Var11;
  ostream *poVar12;
  char *pcVar13;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  size_type sVar14;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar15;
  byte bVar16;
  uint32_t *puVar17;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar18;
  byte *pbVar19;
  byte *pbVar20;
  byte *pbVar21;
  ulong uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  ulong uVar25;
  float *pfVar26;
  uint uVar27;
  ulong uVar28;
  uint64_t index;
  char *new_feature;
  char *new_space;
  stringstream new_feature_buffer;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_290;
  element_type local_280;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_240;
  single_learner *local_238;
  byte *local_230;
  LRQFAstate *local_228;
  size_t local_220;
  byte *local_218;
  byte *local_210;
  ulong local_208;
  features *local_200;
  ulong local_1f8;
  ulong local_1f0;
  uint64_t local_1e8;
  ulong local_1e0;
  unsigned_long local_1d8;
  ulong local_1d0;
  char *local_1c8;
  char *local_1c0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1b8;
  float *local_1b0;
  undefined1 local_1a8 [376];
  
  pvVar3 = lrq->all;
  __s = lrq->orig_size;
  local_238 = base;
  memset(__s,0,0x800);
  pbVar19 = (ec->super_example_predict).indices._end;
  for (pbVar10 = (ec->super_example_predict).indices._begin; pbVar10 != pbVar19;
      pbVar10 = pbVar10 + 1) {
    bVar1 = *pbVar10;
    __s[bVar1] = (long)(ec->super_example_predict).feature_space[bVar1].values._end -
                 (long)(ec->super_example_predict).feature_space[bVar1].values._begin >> 2;
  }
  local_280.first.field_2._M_allocated_capacity =
       (size_type)(ec->super_example_predict).feature_space;
  puVar17 = &(pvVar3->weights).dense_weights._stride_shift;
  puVar9 = &(pvVar3->weights).dense_weights._weight_mask;
  if ((pvVar3->weights).sparse != false) {
    puVar17 = &(pvVar3->weights).sparse_weights._stride_shift;
    puVar9 = &(pvVar3->weights).sparse_weights._weight_mask;
  }
  sVar14 = (lrq->field_name)._M_string_length;
  if (sVar14 != 0) {
    uVar2 = lrq->k;
    local_1e8 = *puVar9;
    local_280.second._M_string_length = (size_type)*puVar17;
    local_280.second._M_dataplus._M_p = (pointer)&(pvVar3->weights).sparse_weights;
    pbVar10 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    local_220 = ec->example_counter;
    local_230 = pbVar10;
    local_228 = lrq;
    do {
      pbVar20 = local_230 + 1;
      pbVar19 = pbVar20;
      local_218 = local_230;
      if (pbVar20 != pbVar10 + sVar14) {
        do {
          local_230 = pbVar19;
          pbVar21 = pbVar20;
          pbVar19 = local_218;
          if ((local_220 & 1) == 0) {
            pbVar21 = local_218;
            pbVar19 = pbVar20;
          }
          uVar25 = (ulong)*pbVar19;
          uVar28 = __s[uVar25];
          local_210 = pbVar20;
          if (uVar28 != 0) {
            bVar1 = *pbVar21;
            local_280.second.field_2._8_8_ = ZEXT18(bVar1);
            local_200 = (features *)(local_280.first.field_2._M_allocated_capacity + uVar25 * 0x68);
            local_1e0 = (ulong)(lrq->field_id[local_280.second.field_2._8_8_] * uVar2);
            this = (features *)
                   (local_280.first.field_2._M_allocated_capacity +
                   local_280.second.field_2._8_8_ * 0x68);
            local_1f0 = (ulong)(lrq->field_id[uVar25] * uVar2);
            local_240 = &((features *)
                         (local_280.first.field_2._M_allocated_capacity +
                         local_280.second.field_2._8_8_ * 0x68))->space_names;
            uVar22 = 0;
            local_208 = uVar25;
            do {
              if (uVar2 != 0) {
                local_280.first.field_2._12_4_ = (local_200->values)._begin[uVar22];
                local_1d8 = (local_200->indicies)._begin[uVar22];
                uVar28 = 1;
                local_1f8 = uVar22;
                do {
                  uVar25 = ((ulong)(uint)((int)uVar28 + (int)local_1e0) <<
                           ((byte)local_280.second._M_string_length & 0x3f)) + local_1d8 & local_1e8
                  ;
                  local_280.second.field_2._M_allocated_capacity = uVar28;
                  if ((pvVar3->weights).sparse == true) {
                    local_290.
                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr = (element_type *)
                              (uVar25 & (pvVar3->weights).sparse_weights._weight_mask);
                    _Var11._M_cur =
                         (__node_type *)
                         std::
                         _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                 *)local_280.second._M_dataplus._M_p,(key_type *)&local_290);
                    if (_Var11._M_cur == (__node_type *)0x0) {
                      local_1b0 = calloc_or_throw<float>
                                            (1L << ((byte)(pvVar3->weights).sparse_weights.
                                                          _stride_shift & 0x3f));
                      this_01._M_p = local_280.second._M_dataplus._M_p;
                      local_1b8 = local_290.
                                  super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr;
                      std::
                      _Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      ::_M_emplace<std::pair<unsigned_long,float*>>
                                ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,float*>,std::allocator<std::pair<unsigned_long_const,float*>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                  *)local_280.second._M_dataplus._M_p,&local_1b8);
                      _Var11._M_cur =
                           (__node_type *)
                           std::
                           _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_float_*>,_std::allocator<std::pair<const_unsigned_long,_float_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                                   *)this_01._M_p,(key_type *)&local_290);
                      p_Var4 = (pvVar3->weights).sparse_weights.fun;
                      if (p_Var4 != (_func_void_weight_ptr_void_ptr *)0x0) {
                        (*p_Var4)(*(weight **)((long)_Var11._M_cur + 0x10),
                                  (pvVar3->weights).sparse_weights.default_data);
                      }
                    }
                    pfVar26 = *(float **)
                               ((long)&((_Var11._M_cur)->
                                       super__Hash_node_value<std::pair<const_unsigned_long,_float_*>,_false>
                                       ).
                                       super__Hash_node_value_base<std::pair<const_unsigned_long,_float_*>_>
                                       ._M_storage._M_storage + 8);
                  }
                  else {
                    pfVar26 = (pvVar3->weights).dense_weights._begin +
                              (uVar25 & (pvVar3->weights).dense_weights._weight_mask);
                  }
                  if (__s[local_280.second.field_2._8_8_] != 0) {
                    iVar7 = (int)local_280.second.field_2._M_allocated_capacity;
                    iVar8 = (int)local_1f0;
                    bVar16 = (byte)local_280.second._M_string_length;
                    local_1d0 = local_280.second.field_2._M_allocated_capacity & 0xffffffff;
                    uVar28 = 0;
                    uVar25 = 1;
                    do {
                      features::push_back(this,*pfVar26 * (float)local_280.first.field_2._12_4_ *
                                               (this->values)._begin[uVar28],
                                          (this->indicies)._begin[uVar28] +
                                          ((ulong)(uint)(iVar7 + iVar8) << (bVar16 & 0x3f)));
                      if ((pvVar3->audit != false) || (pvVar3->hash_inv == true)) {
                        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = bVar1;
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            ((ostream *)local_1a8,(char *)&local_290,1);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr._0_1_ = 0x5e;
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,(char *)&local_290,1);
                        peVar5 = local_240->_begin[uVar28].
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,(peVar5->second)._M_dataplus._M_p,
                                             (peVar5->second)._M_string_length);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = (element_type *)
                                  CONCAT71(local_290.
                                           super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr._1_7_,0x5e);
                        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                            (poVar12,(char *)&local_290,1);
                        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
                        local_1c0 = strdup("lrqfa");
                        std::__cxx11::stringbuf::str();
                        peVar5 = local_290.
                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr;
                        pcVar13 = strdup((char *)local_290.
                                                 super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                                 ._M_ptr);
                        if (peVar5 != &local_280) {
                          operator_delete(peVar5);
                        }
                        local_1c8 = pcVar13;
                        this_02 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)operator_new(0x40);
                        std::
                        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::pair<char_*&,_char_*&,_true>(this_02,&local_1c0,&local_1c8);
                        local_290.
                        super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr = this_02;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<std::pair<std::__cxx11::string,std::__cxx11::string>*>
                                  (&local_290.
                                    super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount,this_02);
                        v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::push_back(local_240,&local_290);
                        if (local_290.
                            super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_refcount._M_pi !=
                            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    (local_290.
                                     super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_refcount._M_pi);
                        }
                        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
                        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
                      }
                      bVar6 = uVar25 < __s[local_280.second.field_2._8_8_];
                      uVar28 = uVar25;
                      uVar25 = (ulong)((int)uVar25 + 1);
                    } while (bVar6);
                  }
                  uVar27 = (int)local_280.second.field_2._M_allocated_capacity + 1;
                  uVar28 = (ulong)uVar27;
                } while (uVar27 <= uVar2);
                uVar28 = __s[local_208];
                uVar22 = local_1f8;
              }
              uVar22 = (ulong)((int)uVar22 + 1);
            } while (uVar22 < uVar28);
            pbVar10 = (byte *)(local_228->field_name)._M_dataplus._M_p;
            sVar14 = (local_228->field_name)._M_string_length;
            lrq = local_228;
          }
          pbVar20 = local_210 + 1;
          pbVar19 = local_230;
        } while (pbVar20 != pbVar10 + sVar14);
      }
      local_230 = pbVar19;
    } while (local_230 != pbVar10 + sVar14);
  }
  (**(code **)(local_238 + 0x30))
            (*(undefined8 *)(local_238 + 0x18),*(undefined8 *)(local_238 + 0x20),ec);
  sVar14 = (lrq->field_name)._M_string_length;
  if (sVar14 != 0) {
    pbVar10 = (byte *)(lrq->field_name)._M_dataplus._M_p;
    pbVar19 = pbVar10 + sVar14;
    uVar23 = local_280.first.field_2._M_allocated_capacity;
    do {
      bVar1 = *pbVar10;
      (((features *)(uVar23 + (ulong)bVar1 * 0x68))->values)._end =
           (((features *)(uVar23 + (ulong)bVar1 * 0x68))->values)._begin + __s[bVar1];
      uVar24 = uVar23;
      if ((pvVar3->audit != false) || (pvVar3->hash_inv == true)) {
        uVar28 = __s[bVar1];
        psVar15 = (((features *)(uVar23 + (ulong)bVar1 * 0x68))->space_names)._begin;
        psVar18 = (((features *)(uVar23 + (ulong)bVar1 * 0x68))->space_names)._end;
        if (uVar28 < (ulong)((long)psVar18 - (long)psVar15 >> 4)) {
          uVar25 = uVar28 << 4 | 8;
          do {
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                       ((long)&(psVar15->
                               super___shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + uVar25);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              psVar15 = (((features *)(uVar23 + (ulong)bVar1 * 0x68))->space_names)._begin;
              psVar18 = (((features *)(uVar23 + (ulong)bVar1 * 0x68))->space_names)._end;
            }
            uVar28 = uVar28 + 1;
            uVar25 = uVar25 + 0x10;
          } while (uVar28 < (ulong)((long)psVar18 - (long)psVar15 >> 4));
          uVar28 = __s[bVar1];
          uVar24 = local_280.first.field_2._M_allocated_capacity;
        }
        (((features *)(uVar23 + (ulong)bVar1 * 0x68))->space_names)._end = psVar15 + uVar28;
      }
      pbVar10 = pbVar10 + 1;
      uVar23 = uVar24;
    } while (pbVar10 != pbVar19);
  }
  return;
}

Assistant:

void predict_or_learn(LRQFAstate& lrq, single_learner& base, example& ec)
{
  vw& all = *lrq.all;

  memset(lrq.orig_size, 0, sizeof(lrq.orig_size));
  for (namespace_index i : ec.indices) lrq.orig_size[i] = ec.feature_space[i].size();

  size_t which = ec.example_counter;
  float first_prediction = 0;
  float first_loss = 0;
  unsigned int maxiter = (is_learn && !example_is_test(ec)) ? 2 : 1;
  unsigned int k = lrq.k;
  float sqrtk = (float)sqrt(k);

  uint32_t stride_shift = lrq.all->weights.stride_shift();
  uint64_t weight_mask = lrq.all->weights.mask();
  for (unsigned int iter = 0; iter < maxiter; ++iter, ++which)
  {
    // Add left LRQ features, holding right LRQ features fixed
    //     and vice versa

    for (string::const_iterator i1 = lrq.field_name.begin(); i1 != lrq.field_name.end(); ++i1)
    {
      for (string::const_iterator i2 = i1 + 1; i2 != lrq.field_name.end(); ++i2)
      {
        unsigned char left = (which % 2) ? *i1 : *i2;
        unsigned char right = ((which + 1) % 2) ? *i1 : *i2;
        unsigned int lfd_id = lrq.field_id[left];
        unsigned int rfd_id = lrq.field_id[right];
        for (unsigned int lfn = 0; lfn < lrq.orig_size[left]; ++lfn)
        {
          features& fs = ec.feature_space[left];
          float lfx = fs.values[lfn];
          uint64_t lindex = fs.indicies[lfn];
          for (unsigned int n = 1; n <= k; ++n)
          {
            uint64_t lwindex =
                (lindex + ((uint64_t)(rfd_id * k + n) << stride_shift));  // a feature has k weights in each field
            float* lw = &all.weights[lwindex & weight_mask];
            // perturb away from saddle point at (0, 0)
            if (is_learn && !example_is_test(ec) && *lw == 0)
              *lw = cheesyrand(lwindex) * 0.5f / sqrtk;

            for (unsigned int rfn = 0; rfn < lrq.orig_size[right]; ++rfn)
            {
              features& rfs = ec.feature_space[right];
              //                    feature* rf = ec.atomics[right].begin + rfn;
              // NB: ec.ft_offset added by base learner
              float rfx = rfs.values[rfn];
              uint64_t rindex = rfs.indicies[rfn];
              uint64_t rwindex = (rindex + ((uint64_t)(lfd_id * k + n) << stride_shift));

              rfs.push_back(*lw * lfx * rfx, rwindex);
              if (all.audit || all.hash_inv)
              {
                std::stringstream new_feature_buffer;
                new_feature_buffer << right << '^' << rfs.space_names[rfn].get()->second << '^' << n;
#ifdef _WIN32
                char* new_space = _strdup("lrqfa");
                char* new_feature = _strdup(new_feature_buffer.str().c_str());
#else
                char* new_space = strdup("lrqfa");
                char* new_feature = strdup(new_feature_buffer.str().c_str());
#endif
                rfs.space_names.push_back(audit_strings_ptr(new audit_strings(new_space, new_feature)));
              }
            }
          }
        }
      }
    }

    if (is_learn)
      base.learn(ec);
    else
      base.predict(ec);

    // Restore example
    if (iter == 0)
    {
      first_prediction = ec.pred.scalar;
      first_loss = ec.loss;
    }
    else
    {
      ec.pred.scalar = first_prediction;
      ec.loss = first_loss;
    }

    for (char i : lrq.field_name)
    {
      namespace_index right = i;
      features& rfs = ec.feature_space[right];
      rfs.values.end() = rfs.values.begin() + lrq.orig_size[right];

      if (all.audit || all.hash_inv)
      {
        for (size_t j = lrq.orig_size[right]; j < rfs.space_names.size(); ++j) rfs.space_names[j].~audit_strings_ptr();

        rfs.space_names.end() = rfs.space_names.begin() + lrq.orig_size[right];
      }
    }
  }
}